

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoCube>::SetRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *this,TPZAutoPointer<TPZRefPattern> *refpat)

{
  bool bVar1;
  int iVar2;
  TPZRefPattern *this_00;
  long *plVar3;
  TPZAutoPointer *in_RSI;
  long *in_RDI;
  TPZVec<long> *unaff_retaddr;
  int i;
  int nsubel;
  TPZRefPattern *in_stack_00000420;
  TPZRefPattern *in_stack_00000428;
  TPZRefPattern *in_stack_ffffffffffffffd0;
  int local_18;
  
  plVar3 = in_RDI;
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x66));
  if (bVar1) {
    in_stack_ffffffffffffffd0 =
         TPZAutoPointer<TPZRefPattern>::operator*((TPZAutoPointer<TPZRefPattern> *)(in_RDI + 0x66));
    TPZAutoPointer<TPZRefPattern>::operator*((TPZAutoPointer<TPZRefPattern> *)in_RSI);
    iVar2 = TPZRefPattern::operator==(in_stack_00000428,in_stack_00000420);
    if (iVar2 != 0) {
      return;
    }
  }
  iVar2 = (**(code **)(*in_RDI + 0x1d0))();
  if (iVar2 == 0) {
    TPZAutoPointer<TPZRefPattern>::operator=
              ((TPZAutoPointer<TPZRefPattern> *)in_RSI,
               (TPZAutoPointer<TPZRefPattern> *)in_stack_ffffffffffffffd0);
    bVar1 = ::TPZAutoPointer::operator_cast_to_bool(in_RSI);
    if (bVar1) {
      this_00 = TPZAutoPointer<TPZRefPattern>::operator->((TPZAutoPointer<TPZRefPattern> *)in_RSI);
      iVar2 = TPZRefPattern::NSubElements(this_00);
      TPZVec<long>::Resize(unaff_retaddr,(int64_t)plVar3);
      for (local_18 = 0; local_18 < iVar2; local_18 = local_18 + 1) {
        plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x62),(long)local_18);
        *plVar3 = -1;
      }
    }
    else {
      TPZVec<long>::Resize(unaff_retaddr,(int64_t)plVar3);
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "Trying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n"
                   );
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::SetRefPattern (TPZAutoPointer<TPZRefPattern> refpat){
	
#ifdef HUGE_DEBUG
	if (!refpat) {
		PZError << "Error trying to set a null refinement pattern objetct" << std::endl;
		return;
	}
#endif
	
	if(fRefPattern && (*fRefPattern == *refpat)){//they are the same refinement pattern
		return;
	}
	else if(this->HasSubElement())
	{
#ifdef PZ_LOG
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
		LOGPZ_ERROR ( loggerrefpattern, "\nTrying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n" );
#endif
		std::cout << "Trying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n";
		
		return;
	}
	fRefPattern = refpat;
    if(!refpat)
    {
        fSubEl.Resize(0);
    }
    else
    {
        int nsubel = refpat->NSubElements();
        fSubEl.Resize(nsubel);
        for(int i=0;i<nsubel;i++) fSubEl[i] = -1;
    }
}